

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::TestCaseInfo::tagsAsString_abi_cxx11_(TestCaseInfo *this)

{
  StringRef rhs;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type in_RSI;
  string *in_RDI;
  Tag *tag_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *__range1_1;
  Tag *tag;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *__range1;
  size_t full_size;
  string *ret;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *in_stack_ffffffffffffff58;
  string *psVar4;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  local_60;
  long local_58;
  StringRef *local_40;
  Tag *local_38;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  local_30;
  long local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  psVar4 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  sVar2 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::size
                    ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)(in_RSI + 0x50));
  local_20 = sVar2 << 1;
  local_28 = in_RSI + 0x50;
  local_30._M_current =
       (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::begin(in_stack_ffffffffffffff58)
  ;
  local_38 = (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::end
                              (in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    local_40 = &__gnu_cxx::
                __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                ::operator*(&local_30)->original;
    sVar3 = StringRef::size(local_40);
    local_20 = sVar3 + local_20;
    __gnu_cxx::
    __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
    operator++(&local_30);
  }
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_58 = in_RSI + 0x50;
  local_60._M_current =
       (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::begin(in_stack_ffffffffffffff58)
  ;
  std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::end(in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
    operator*(&local_60);
    std::__cxx11::string::push_back((char)in_RDI);
    rhs.m_size = in_RSI;
    rhs.m_start = (char *)psVar4;
    operator+=(in_RDI,rhs);
    std::__cxx11::string::push_back((char)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
    operator++(&local_60);
  }
  return psVar4;
}

Assistant:

std::string TestCaseInfo::tagsAsString() const {
        std::string ret;
        // '[' and ']' per tag
        std::size_t full_size = 2 * tags.size();
        for (const auto& tag : tags) {
            full_size += tag.original.size();
        }
        ret.reserve(full_size);
        for (const auto& tag : tags) {
            ret.push_back('[');
            ret += tag.original;
            ret.push_back(']');
        }

        return ret;
    }